

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::File_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (File_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  size_t i;
  long lVar2;
  long lVar3;
  Boxed_Value BVar4;
  undefined1 local_40 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  lVar3 = (long)t_ss[2].m_conversions.m_saves._M_data -
          (long)t_ss[2].m_conversions.m_conversions._M_data;
  if (lVar3 == 0) {
    BVar4 = void_var();
    _Var1._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    for (lVar2 = 0; (lVar3 >> 3) + -1 != lVar2; lVar2 = lVar2 + 1) {
      AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_40,
                 *(Dispatch_State **)
                  ((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock
                  + lVar2 * 8));
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    }
    BVar4 = AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                      (&this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,
                       (Dispatch_State *)
                       t_ss[2].m_conversions.m_saves._M_data[-1].saves.
                       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    _Var1._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        try {
          const auto num_children = this->children.size();

          if (num_children > 0) {
            for (size_t i = 0; i < num_children - 1; ++i) {
              this->children[i]->eval(t_ss);
            }
            return this->children.back()->eval(t_ss);
          } else {
            return void_var();
          }
        } catch (const detail::Continue_Loop &) {
          throw exception::eval_error("Unexpected `continue` statement outside of a loop");
        } catch (const detail::Break_Loop &) {
          throw exception::eval_error("Unexpected `break` statement outside of a loop");
        }
      }